

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O3

int main(void)

{
  slab_cache **ppsVar1;
  long lVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  void *pvVar9;
  char *pcVar10;
  long *plVar11;
  undefined8 *__s1;
  rlist *ptr;
  uint uVar12;
  size_t sVar13;
  ulong uVar14;
  char *pcVar15;
  ulong extraout_RDX;
  slab_cache *psVar16;
  slab_cache *psVar17;
  region *prVar18;
  rlist *prVar19;
  char *pcVar20;
  slab_cache *psVar21;
  region local_3a8;
  undefined8 uStack_360;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined4 local_348;
  ulong local_88;
  ulong local_80;
  undefined1 local_78 [8];
  region region;
  
  plan(6);
  _space((FILE *)_stdout);
  printf("# *** %s ***\n","main");
  uVar8 = time((time_t *)0x0);
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fprintf(_stdout,"random seed is %u",uVar8 & 0xffffffff);
  fputc(10,_stdout);
  srand((uint)uVar8);
  quota.value = 0x40000000000000;
  pcVar20 = (char *)0x2;
  slab_arena_create(&arena,&quota,0,4000000,2);
  slab_cache_create(&cache,&arena);
  region_basic();
  region_test_truncate();
  region_test_callbacks();
  plan(1);
  _space((FILE *)_stdout);
  uVar8 = 0;
  printf("# *** %s ***\n");
  region.cache = (slab_cache *)&region;
  local_78 = (undefined1  [8])&cache;
  region.slabs.slabs.next = (rlist *)0x0;
  region.slabs.stats.used = 0;
  region.slabs.stats.total = 0;
  region.on_alloc_cb = (region_on_alloc_f)0x0;
  region.on_truncate_cb = (region_on_truncate_f)0x0;
  region.cb_arg = (void *)0x0;
  region.slabs.slabs.prev = (rlist *)region.cache;
  do {
    iVar4 = rand();
    uVar12 = -(iVar4 >> 0x1f);
    if (iVar4 % 99 < 0) {
      prVar18 = (region *)local_78;
      psVar16 = (slab_cache *)0x0;
      pvVar9 = region_join(prVar18,0);
      if (pvVar9 == (void *)0x0) goto LAB_00104158;
    }
    else {
      local_88 = (ulong)(iVar4 % 99 + 1);
      uVar14 = 0;
      psVar17 = (slab_cache *)0x0;
      local_80 = uVar8;
      do {
        iVar4 = rand();
        uVar12 = (iVar4 / 0x309) * 0x309;
        iVar4 = iVar4 % 0x309 + 1;
        if (iVar4 == 0) goto LAB_00104103;
        psVar21 = (slab_cache *)(long)iVar4;
        region.cb_arg = (void *)0x0;
        if (((region *)region.slabs.slabs.prev == &region) &&
           ((slab_cache *)region.slabs.slabs.prev == region.cache)) {
LAB_001039ef:
          prVar18 = (region *)local_78;
          psVar16 = psVar21;
          pvVar9 = region_reserve_slow(prVar18,(size_t)psVar21);
          if (pvVar9 == (void *)0x0) {
            main_cold_2();
            goto LAB_00104158;
          }
          uVar5 = *(uint *)&region.slabs.slabs.prev[2].prev;
          psVar16 = (slab_cache *)(ulong)((*(int *)&region.slabs.slabs.prev[1].prev - uVar5) - 0x38)
          ;
        }
        else {
          uVar5 = *(uint *)&region.slabs.slabs.prev[2].prev;
          uVar12 = (*(int *)&region.slabs.slabs.prev[1].prev - uVar5) - 0x38;
          psVar16 = (slab_cache *)(ulong)uVar12;
          if (psVar16 < psVar21) goto LAB_001039ef;
          pvVar9 = (void *)((long)&region.slabs.slabs.prev[2].next + (ulong)uVar5);
        }
        prVar19 = region.slabs.slabs.prev;
        region.cb_arg = (void *)0x1;
        if (psVar16 < psVar21) goto LAB_00103f82;
        sVar13 = region.slabs.stats.total;
        if (region.slabs.stats.total != 0) {
          (*(code *)region.slabs.stats.total)(local_78,psVar21,region.on_truncate_cb);
          uVar5 = *(uint *)&prVar19[2].prev;
        }
        uVar12 = (uint)sVar13;
        region.slabs.slabs.next = (rlist *)((long)&(region.slabs.slabs.next)->prev + (long)psVar21);
        *(uint *)&prVar19[2].prev = uVar5 + iVar4;
        region.cb_arg = (void *)0x0;
        uVar8 = uVar14 + 1;
        memset(pvVar9,(int)uVar8,(size_t)psVar21);
        (&local_3a8.cache)[uVar14] = psVar21;
        uVar3 = local_88;
        psVar16 = (slab_cache *)
                  ((long)&psVar21->orders[0].slabs.prev + (long)(psVar17->orders + -3));
        uVar14 = uVar8;
        psVar17 = psVar16;
      } while (local_88 != uVar8);
      prVar18 = (region *)local_78;
      pcVar10 = (char *)region_join(prVar18,(size_t)psVar16);
      if (pcVar10 == (char *)0x0) {
LAB_00104158:
        main_cold_9();
        goto LAB_0010415d;
      }
      uVar14 = 0;
      do {
        ppsVar1 = &local_3a8.cache + uVar14;
        uVar14 = uVar14 + 1;
        if (0 < (long)*ppsVar1) {
          pcVar15 = pcVar10 + (long)*ppsVar1;
          do {
            if (uVar14 != (uint)(int)*pcVar10) {
              main_cold_1();
              goto LAB_00104103;
            }
            pcVar10 = pcVar10 + 1;
          } while (pcVar10 < pcVar15);
        }
        uVar8 = local_80;
      } while (uVar14 != uVar3);
    }
    uVar12 = (int)uVar8 + 1;
    uVar8 = (ulong)uVar12;
  } while (uVar12 != 0xd9);
  region_free((region *)local_78);
  pcVar20 = "line %d";
  psVar17 = (slab_cache *)0x0;
  _ok(1,"true","/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/region.c",
      0xbf,"line %d",0xbf);
  _space((FILE *)_stdout);
  printf("# *** %s: done ***\n","region_test_join");
  check_plan();
  plan(1);
  _space((FILE *)_stdout);
  printf("# *** %s ***\n","region_test_alignment");
  local_3a8.slabs.slabs.prev = &local_3a8.slabs.slabs;
  local_3a8.cache = &cache;
  local_3a8.slabs.stats.used = 0;
  local_3a8.slabs.stats.total = 0;
  local_3a8.on_alloc_cb = (region_on_alloc_f)0x0;
  local_3a8.on_truncate_cb = (region_on_truncate_f)0x0;
  local_3a8.cb_arg = (void *)0x0;
  local_3a8.reserved = 0;
  iVar4 = 9999;
  local_3a8.slabs.slabs.next = local_3a8.slabs.slabs.prev;
  do {
    uVar12 = rand();
    sVar13 = local_3a8.slabs.stats.used;
    prVar18 = &local_3a8;
    if ((int)uVar12 % 7 == 1) {
      if ((psVar17 != (slab_cache *)0x0) &&
         (pvVar9 = region_join(&local_3a8,(size_t)psVar17), pvVar9 == (void *)0x0))
      goto LAB_0010416c;
      psVar17 = (slab_cache *)0x0;
    }
    else if ((int)uVar12 % 7 == 0) {
      iVar6 = rand();
      uVar12 = (iVar6 / 0x14d) * 0x14d;
      iVar6 = iVar6 % 0x14d + 1;
      if (iVar6 == 0) {
LAB_00104103:
        __assert_fail("size > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/region.h"
                      ,0xef,"void *region_alloc(struct region *, size_t)");
      }
      psVar21 = (slab_cache *)(long)iVar6;
      local_3a8.reserved = 0;
      if (((slab_list *)local_3a8.slabs.slabs.next == &local_3a8.slabs) &&
         (local_3a8.slabs.slabs.next == local_3a8.slabs.slabs.prev)) {
LAB_00103c5f:
        psVar16 = psVar21;
        pvVar9 = region_reserve_slow(&local_3a8,(size_t)psVar21);
        if (pvVar9 == (void *)0x0) goto LAB_00104167;
        iVar7 = *(int *)&local_3a8.slabs.slabs.next[2].prev;
        psVar16 = (slab_cache *)
                  (ulong)((*(int *)&local_3a8.slabs.slabs.next[1].prev - iVar7) - 0x38);
      }
      else {
        iVar7 = *(int *)&local_3a8.slabs.slabs.next[2].prev;
        uVar12 = (*(int *)&local_3a8.slabs.slabs.next[1].prev - iVar7) - 0x38;
        psVar16 = (slab_cache *)(ulong)uVar12;
        if (psVar16 < psVar21) goto LAB_00103c5f;
      }
      prVar19 = local_3a8.slabs.slabs.next;
      local_3a8.reserved = 1;
      if (psVar16 < psVar21) goto LAB_00103f82;
      if (local_3a8.on_alloc_cb != (region_on_alloc_f)0x0) {
        (*local_3a8.on_alloc_cb)(&local_3a8,(size_t)psVar21,local_3a8.cb_arg);
        iVar7 = *(int *)&prVar19[2].prev;
      }
      local_3a8.slabs.stats.used = (long)psVar21->orders + (local_3a8.slabs.stats.used - 0x30);
      *(int *)&prVar19[2].prev = iVar7 + iVar6;
      local_3a8.reserved = 0;
      psVar17 = (slab_cache *)((long)&psVar21->orders[0].slabs.prev + (long)(psVar17->orders + -3));
    }
    else {
      iVar6 = rand();
      uVar8 = (ulong)(uint)(2 << ((char)iVar6 + (char)(iVar6 / 5) * -5 & 0x1fU));
      iVar6 = rand();
      uVar12 = (iVar6 / 0x14d) * -0x14d;
      psVar16 = (slab_cache *)(long)(iVar6 % 0x14d + 1);
      pvVar9 = region_aligned_alloc(&local_3a8,(size_t)psVar16,uVar8);
      if (pvVar9 == (void *)0x0) goto LAB_00104162;
      if ((uVar8 - 1 & (ulong)pvVar9) != 0) goto LAB_0010415d;
      psVar17 = (slab_cache *)((long)psVar17 + (local_3a8.slabs.stats.used - sVar13));
    }
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  region_free(&local_3a8);
  pcVar20 = "line %d";
  uVar12 = 0xea;
  _ok(1,"true","/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/region.c",
      0xea,"line %d",0xea);
  _space((FILE *)_stdout);
  printf("# *** %s: done ***\n","region_test_alignment");
  check_plan();
  plan(2);
  _space((FILE *)_stdout);
  printf("# *** %s ***\n","region_test_poison");
  local_78 = (undefined1  [8])&cache;
  region.slabs.slabs.next = (rlist *)0x0;
  region.slabs.stats.used = 0;
  region.slabs.stats.total = 0;
  region.on_alloc_cb = (region_on_alloc_f)0x0;
  region.on_truncate_cb = (region_on_truncate_f)0x0;
  region.cb_arg = (void *)0x0;
  local_358 = 0x5050505050505050;
  uStack_350 = 0x5050505050505050;
  local_3a8.reserved = 0x5050505050505050;
  uStack_360 = 0x5050505050505050;
  local_3a8.on_truncate_cb = (region_on_truncate_f)0x5050505050505050;
  local_3a8.cb_arg = (void *)0x5050505050505050;
  local_3a8.slabs.stats.total = 0x5050505050505050;
  local_3a8.on_alloc_cb = (region_on_alloc_f)0x5050505050505050;
  local_3a8.slabs.slabs.next = (rlist *)0x5050505050505050;
  local_3a8.slabs.stats.used = 0x5050505050505050;
  local_3a8.cache = (slab_cache *)0x5050505050505050;
  local_3a8.slabs.slabs.prev = (rlist *)0x5050505050505050;
  local_348 = 0x50505050;
  region.cache = (slab_cache *)&region;
  region.slabs.slabs.prev = (rlist *)&region;
  region_reserve_slow((region *)local_78,100);
  region.cb_arg = (void *)0x0;
  if (((slab_cache *)region.slabs.slabs.prev == (slab_cache *)&region) &&
     ((slab_cache *)region.slabs.slabs.prev == region.cache)) {
LAB_00103eac:
    prVar18 = (region *)local_78;
    psVar17 = (slab_cache *)0xa;
    plVar11 = (long *)region_reserve_slow(prVar18,10);
    if (plVar11 == (long *)0x0) goto LAB_00104171;
    uVar5 = *(uint *)&region.slabs.slabs.prev[2].prev;
    region.cb_arg = (void *)0x1;
    if ((*(int *)&region.slabs.slabs.prev[1].prev - uVar5) - 0x38 < 10) goto LAB_00103f82;
  }
  else {
    uVar5 = *(uint *)&region.slabs.slabs.prev[2].prev;
    uVar12 = (*(int *)&region.slabs.slabs.prev[1].prev - uVar5) - 0x38;
    if (uVar12 < 10) goto LAB_00103eac;
    plVar11 = (long *)((long)&region.slabs.slabs.prev[2].next + (ulong)uVar5);
  }
  prVar19 = region.slabs.slabs.prev;
  region.cb_arg = (void *)0x1;
  sVar13 = region.slabs.stats.total;
  if (region.slabs.stats.total != 0) {
    (*(code *)region.slabs.stats.total)(local_78,10,region.on_truncate_cb);
    uVar5 = *(uint *)&prVar19[2].prev;
  }
  uVar12 = (uint)sVar13;
  region.slabs.slabs.next = (rlist *)((long)&(region.slabs.slabs.next)->next + 2);
  *(uint *)&prVar19[2].prev = uVar5 + 10;
  *plVar11 = 0;
  *(undefined2 *)(plVar11 + 1) = 0;
  region.cb_arg = (void *)0x0;
  if (((region *)region.slabs.slabs.prev != &region) ||
     ((slab_cache *)region.slabs.slabs.prev != region.cache)) {
    uVar5 = *(uint *)&region.slabs.slabs.prev[2].prev;
    uVar12 = (*(int *)&region.slabs.slabs.prev[1].prev - uVar5) - 0x38;
    if (0x59 < uVar12) {
      __s1 = (undefined8 *)((long)&region.slabs.slabs.prev[2].next + (ulong)uVar5);
      goto LAB_00103fb1;
    }
  }
  prVar18 = (region *)local_78;
  psVar17 = (slab_cache *)0x5a;
  __s1 = (undefined8 *)region_reserve_slow(prVar18,0x5a);
  if (__s1 != (undefined8 *)0x0) {
    uVar5 = *(uint *)&region.slabs.slabs.prev[2].prev;
    region.cb_arg = (void *)0x1;
    if ((*(int *)&region.slabs.slabs.prev[1].prev - uVar5) - 0x38 < 0x5a) {
LAB_00103f82:
      __assert_fail("size <= rslab_unused(slab)",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/include/small/region.h"
                    ,0xf8,"void *region_alloc(struct region *, size_t)");
    }
LAB_00103fb1:
    prVar19 = region.slabs.slabs.prev;
    region.cb_arg = (void *)0x1;
    if (region.slabs.stats.total != 0) {
      (*(code *)region.slabs.stats.total)(local_78,0x5a,region.on_truncate_cb);
      uVar5 = *(uint *)&prVar19[2].prev;
    }
    region.slabs.slabs.next = (rlist *)((long)&region.slabs.slabs.next[5].next + 2);
    *(uint *)&prVar19[2].prev = uVar5 + 0x5a;
    region.cb_arg = (void *)0x0;
    *(undefined8 *)((long)__s1 + 0x4a) = 0;
    *(undefined8 *)((long)__s1 + 0x52) = 0;
    __s1[8] = 0;
    __s1[9] = 0;
    __s1[6] = 0;
    __s1[7] = 0;
    __s1[4] = 0;
    __s1[5] = 0;
    __s1[2] = 0;
    __s1[3] = 0;
    *__s1 = 0;
    __s1[1] = 0;
    region_truncate((region *)local_78,10);
    iVar4 = bcmp(__s1,&local_3a8,0x5a);
    _ok((uint)(iVar4 == 0),"memcmp(ptr2, pattern, 90) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/region.c",0x107,
        "line %d",0x107);
    region_truncate((region *)local_78,0);
    _ok((uint)((short)plVar11[1] == (short)local_3a8.slabs.slabs.prev &&
              (slab_cache *)*plVar11 == local_3a8.cache),"memcmp(ptr1, pattern, 10) == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/region.c",0x10a,
        "line %d",0x10a);
    _space((FILE *)_stdout);
    printf("# *** %s: done ***\n","region_test_poison");
    check_plan();
    slab_cache_destroy(&cache);
    _space((FILE *)_stdout);
    printf("# *** %s: done ***\n","main");
    iVar4 = check_plan();
    return iVar4;
  }
LAB_00104176:
  main_cold_6();
  uVar5 = (uint)pcVar20;
  uVar8 = 0x10000;
  if (0x10000 < uVar12) {
    uVar8 = (ulong)uVar12;
  }
  lVar2 = 0x3f;
  if (uVar8 - 1 != 0) {
    for (; uVar8 - 1 >> lVar2 == 0; lVar2 = lVar2 + -1) {
    }
  }
  uVar14 = 1L << (-((byte)lVar2 ^ 0x3f) & 0x3f);
  prVar18->cache = (slab_cache *)0x0;
  *(int *)&prVar18->on_alloc_cb = (int)uVar14;
  (prVar18->slabs).stats.total = (size_t)psVar17;
  uVar8 = (ulong)*(uint *)((long)&psVar17->arena + 4) << 10;
  if (extraout_RDX <= uVar8) {
    uVar8 = extraout_RDX;
  }
  uVar14 = uVar14 & 0xffffffff;
  prVar19 = (rlist *)(-uVar14 & (uVar8 + uVar14) - 1);
  (prVar18->slabs).slabs.next = prVar19;
  (prVar18->slabs).stats.used = 0;
  if ((int)uVar5 < 0) {
    if ((~uVar5 & 0x80000002) != 0 && (~uVar5 & 0x80000001) != 0) {
      __assert_fail("IS_SLAB_ARENA_FLAG(flags, SLAB_ARENA_PRIVATE) || IS_SLAB_ARENA_FLAG(flags, SLAB_ARENA_SHARED)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/slab_arena.c"
                    ,0xad,"void slab_arena_flags_init(struct slab_arena *, int)");
    }
    *(uint *)((long)&prVar18->on_alloc_cb + 4) = uVar5;
  }
  else {
    if (((ulong)pcVar20 & 3) == 0) {
      __assert_fail("flags & (MAP_PRIVATE | MAP_SHARED)",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/slab_arena.c"
                    ,0xa4,"void slab_arena_flags_init(struct slab_arena *, int)");
    }
    if (uVar5 == 2) {
      *(undefined4 *)((long)&prVar18->on_alloc_cb + 4) = 0x80000001;
      uVar5 = 0x80000001;
    }
    else {
      *(undefined4 *)((long)&prVar18->on_alloc_cb + 4) = 0x80000002;
      uVar5 = 0x80000002;
    }
  }
  iVar4 = 0;
  if (prVar19 == (rlist *)0x0) {
    prVar19 = (rlist *)0x0;
    ptr = (rlist *)0x0;
  }
  else {
    ptr = (rlist *)mmap_checked((size_t)prVar19,uVar14,uVar5);
    prVar19 = (prVar18->slabs).slabs.next;
    uVar5 = *(uint *)((long)&prVar18->on_alloc_cb + 4);
  }
  (prVar18->slabs).slabs.prev = ptr;
  madvise_checked(ptr,(size_t)prVar19,uVar5);
  if ((prVar18->slabs).slabs.next != (rlist *)0x0) {
    iVar4 = -(uint)((prVar18->slabs).slabs.prev == (rlist *)0x0);
  }
  return iVar4;
LAB_0010415d:
  main_cold_5();
LAB_00104162:
  main_cold_8();
LAB_00104167:
  main_cold_4();
  psVar17 = psVar16;
LAB_0010416c:
  main_cold_3();
LAB_00104171:
  main_cold_7();
  goto LAB_00104176;
}

Assistant:

int main()
{
#ifdef ENABLE_ASAN
	plan(8);
#else
#ifndef NDEBUG
	plan(6);
#else
	plan(5);
#endif
#endif
	header();

	unsigned int seed = time(NULL);
	note("random seed is %u", seed);
	srand(seed);
	quota_init(&quota, UINT_MAX);
	slab_arena_create(&arena, &quota, 0,
			  4000000, MAP_PRIVATE);
	slab_cache_create(&cache, &arena);

	region_basic();
	region_test_truncate();
	region_test_callbacks();
	region_test_join();
	region_test_alignment();
#ifndef ENABLE_ASAN
#ifndef NDEBUG
	region_test_poison();
#endif
#else
	region_test_poison();
	region_test_tiny_reserve_size();
	region_test_truncate_reserved();
#endif

	slab_cache_destroy(&cache);

	footer();
	return check_plan();
}